

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  uint uVar1;
  void *pvVar2;
  int n;
  int n_00;
  ImSpanAllocator<6> local_68;
  
  local_68.Offsets[1] = columns_count * 0x70;
  local_68.Offsets[4] = 0;
  local_68.Offsets[5] = 0;
  local_68.Sizes[4] = 0;
  local_68.Sizes[5] = 0;
  local_68.BasePtr = (char *)0x0;
  local_68.Sizes[1] = columns_count * 2;
  local_68.Offsets[0] = 0;
  uVar1 = columns_count * 0x72 + 3;
  local_68.Offsets._8_8_ = (ulong)uVar1 & 0xfffffffffffffffc;
  local_68.Sizes[3] = 0;
  local_68.Sizes[2] = columns_count << 3;
  local_68.CurrIdx = 3;
  local_68.CurrOff = (uVar1 & 0xfffffffc) + columns_count * 8;
  local_68.Sizes[0] = local_68.Offsets[1];
  for (n_00 = 3; n_00 != 6; n_00 = n_00 + 1) {
    ImSpanAllocator<6>::Reserve
              (&local_68,n_00,(long)((ulong)(uint)(columns_count + 0x1f >> 5) << 0x22) >> 0x20,4);
  }
  pvVar2 = MemAlloc((long)local_68.CurrOff);
  table->RawData = pvVar2;
  memset(pvVar2,0,(long)local_68.CurrOff);
  pvVar2 = table->RawData;
  (table->Columns).Data = (ImGuiTableColumn *)((long)local_68.Offsets[0] + (long)pvVar2);
  (table->Columns).DataEnd =
       (ImGuiTableColumn *)
       ((long)&((ImGuiTableColumn *)((long)local_68.Offsets[0] + (long)pvVar2))->Flags +
       (long)local_68.Sizes[0]);
  (table->DisplayOrderToIndex).Data = (short *)((long)local_68.Offsets[1] + (long)pvVar2);
  (table->DisplayOrderToIndex).DataEnd =
       (short *)((long)local_68.Sizes[1] + (long)local_68.Offsets[1] + (long)pvVar2);
  (table->RowCellData).Data = (ImGuiTableCellData *)((long)local_68.Offsets[2] + (long)pvVar2);
  (table->RowCellData).DataEnd =
       (ImGuiTableCellData *)
       ((long)&((ImGuiTableCellData *)((long)local_68.Offsets[2] + (long)pvVar2))->BgColor +
       (long)local_68.Sizes[2]);
  table->EnabledMaskByDisplayOrder = (ImBitArrayPtr)((long)local_68.Offsets[3] + (long)pvVar2);
  table->EnabledMaskByIndex = (ImBitArrayPtr)((long)local_68.Offsets[4] + (long)pvVar2);
  table->VisibleMaskByIndex = (ImBitArrayPtr)((long)local_68.Offsets[5] + (long)pvVar2);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    const int columns_bit_array_size = (int)ImBitArrayGetStorageSizeInBytes(columns_count);
    ImSpanAllocator<6> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    for (int n = 3; n < 6; n++)
        span_allocator.Reserve(n, columns_bit_array_size);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
    table->EnabledMaskByDisplayOrder = (ImU32*)span_allocator.GetSpanPtrBegin(3);
    table->EnabledMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(4);
    table->VisibleMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(5);
}